

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  decimal_fp<float> *pdVar1;
  locale_ref loc_00;
  int iVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  type tVar6;
  appender aVar7;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint value;
  digit_grouping<char> *this;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  sign_t sVar16;
  locale_ref in_stack_fffffffffffffed8;
  char local_11f;
  sign_t sign;
  char zero;
  bool pointy;
  undefined3 uStack_11b;
  int significand_size;
  significand_type significand;
  ulong local_110;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_108;
  undefined8 local_100;
  format_specs<char> *local_f8;
  locale_ref local_f0;
  ulong local_e8;
  int local_dc;
  significand_type local_d8;
  int exp;
  float_specs fspecs_local;
  anon_class_28_8_ad0ecca5 write;
  undefined4 uStack_ac;
  digit_grouping<char> grouping;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = f->significand;
  local_108 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_100 = f;
  local_f8 = specs;
  local_d8 = significand;
  fspecs_local = fspecs;
  iVar5 = get_significand_size<float>(f);
  zero = '0';
  sVar16 = fspecs._5_1_;
  sign = sVar16;
  significand_size = iVar5;
  tVar6 = to_unsigned<int>(iVar5);
  local_110 = (ulong)((tVar6 + 1) - (uint)(sVar16 == none));
  cVar3 = '.';
  local_e8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar3 = decimal_point_impl<char>(in_stack_fffffffffffffed8);
  }
  pdVar1 = local_100;
  iVar15 = local_100->exponent;
  local_dc = iVar15 + iVar5 + -1;
  local_11f = cVar3;
  local_f0.locale_ = loc.locale_;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_dc;
  bVar4 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar13 = local_110;
  uVar12 = fspecs.precision;
  uVar9 = (uint)local_e8;
  if (bVar4) {
    iVar15 = iVar15 + iVar5;
    if ((uVar9 >> 0x13 & 1) == 0) {
      local_100 = (decimal_fp<float> *)((ulong)local_100._4_4_ << 0x20);
      if (iVar5 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      iVar11 = 0;
      if (0 < (int)(uVar12 - iVar5)) {
        iVar11 = uVar12 - iVar5;
      }
      local_100 = (decimal_fp<float> *)CONCAT44(local_100._4_4_,iVar11);
      tVar6 = to_unsigned<int>(iVar11);
      uVar13 = local_110 + tVar6;
    }
    iVar2 = local_dc;
    iVar11 = 1 - iVar15;
    if (0 < iVar15) {
      iVar11 = local_dc;
    }
    iVar15 = 2;
    if (99 < iVar11) {
      iVar15 = (999 < iVar11) + 3;
    }
    tVar6 = to_unsigned<int>((3 - (uint)(cVar3 == '\0')) + iVar15);
    write.sign = sVar16;
    write.significand = local_d8;
    write.decimal_point = cVar3;
    write.significand_size = iVar5;
    write._16_5_ = CONCAT14('0',(int)local_100);
    write._16_8_ = CONCAT26(write._22_2_,CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,write._16_5_)) |
                   0x450000000000;
    write.output_exp = iVar2;
    if (0 < local_f8->width) {
      aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                        ((appender)local_108.container,local_f8,uVar13 + tVar6,&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    aVar7 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
            ::anon_class_28_8_ad0ecca5::operator()(&write,(iterator)local_108.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  iVar11 = pdVar1->exponent;
  iVar15 = iVar11 + iVar5;
  exp = iVar15;
  if (-1 < iVar11) {
    tVar6 = to_unsigned<int>(iVar11);
    loc_00.locale_ = local_f0.locale_;
    lVar10 = tVar6 + local_110;
    _pointy = uVar12 - iVar15;
    uVar9 = (uint)local_e8;
    if ((uVar9 >> 0x13 & 1) != 0) {
      lVar10 = lVar10 + 1;
      if ((char)local_e8 == '\x02' || 0 < (int)_pointy) {
        if (0 < (int)_pointy) {
          tVar6 = to_unsigned<int>(_pointy);
          lVar10 = lVar10 + (ulong)tVar6;
        }
      }
      else {
        _pointy = 0;
      }
    }
    digit_grouping<char>::digit_grouping(&grouping,loc_00,(bool)((byte)(uVar9 >> 0x11) & 1));
    iVar5 = digit_grouping<char>::count_separators(&grouping,iVar15);
    tVar6 = to_unsigned<int>(iVar5);
    write._0_8_ = &sign;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    stack0xffffffffffffff50 = local_100;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>
                   (local_108.container,local_f8,lVar10 + (ulong)tVar6,
                    (anon_class_72_9_0c6a3a8a *)&write);
    this = &grouping;
LAB_001108fa:
    digit_grouping<char>::~digit_grouping(this);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar8.container;
  }
  if (0 < iVar15) {
    _pointy = uVar12 - iVar5 & (int)(uVar9 << 0xc) >> 0x1f;
    uVar12 = _pointy;
    if ((int)_pointy < 1) {
      uVar12 = 0;
    }
    tVar6 = to_unsigned<int>(uVar12);
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&write,local_f0,(bool)((byte)(uVar9 >> 0x11) & 1));
    iVar5 = digit_grouping<char>::count_separators((digit_grouping<char> *)&write,iVar15);
    lVar10 = (tVar6 + 1) + local_110;
    tVar6 = to_unsigned<int>(iVar5);
    grouping.grouping_._M_dataplus._M_p = (pointer)&sign;
    grouping.grouping_._M_string_length = (size_type)&significand;
    grouping.grouping_.field_2._M_allocated_capacity = (size_type)&significand_size;
    grouping.grouping_.field_2._8_8_ = &exp;
    grouping.thousands_sep_._M_dataplus._M_p = &local_11f;
    grouping.thousands_sep_.field_2._M_allocated_capacity = (size_type)&pointy;
    grouping.thousands_sep_.field_2._8_8_ = &zero;
    grouping.thousands_sep_._M_string_length = (size_type)&write;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>
                   (local_108.container,local_f8,(ulong)tVar6 + lVar10,
                    (anon_class_64_8_e6ffa566 *)&grouping);
    this = (digit_grouping<char> *)&write;
    goto LAB_001108fa;
  }
  uVar14 = -iVar15;
  value = uVar14;
  if (uVar12 < uVar14) {
    value = uVar12;
  }
  if ((int)uVar12 < 0) {
    value = uVar14;
  }
  if (iVar5 != 0) {
    value = uVar14;
  }
  grouping.grouping_._M_dataplus._M_p._0_4_ = value;
  if (iVar5 == 0 && value == 0) {
    _pointy = CONCAT31(uStack_11b,(char)((uVar9 & 0x80000) >> 0x13));
    if ((local_e8 & 0x80000) == 0) {
      iVar5 = 1;
      goto LAB_00110953;
    }
  }
  else {
    _pointy = CONCAT31(uStack_11b,1);
  }
  iVar5 = 2;
LAB_00110953:
  tVar6 = to_unsigned<int>(value);
  write._0_8_ = &sign;
  write._8_8_ = &zero;
  write._16_8_ = &pointy;
  unique0x00004e80 = &local_11f;
  aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>
                    ((appender)local_108.container,local_f8,(iVar5 + tVar6) + uVar13,
                     (anon_class_56_7_162c6e41 *)&write);
  return (appender)
         aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}